

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O2

void scaleSimplexCost(HighsOptions *options,HighsLp *lp,double *cost_scale)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double __x;
  
  dVar4 = ldexp(1.0,(options->super_HighsOptionsStruct).allowed_cost_scale_factor);
  uVar3 = 0;
  uVar2 = (ulong)(uint)lp->num_col_;
  if (lp->num_col_ < 1) {
    uVar2 = uVar3;
  }
  __x = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    if (((dVar5 != 0.0) || (NAN(dVar5))) && (__x <= ABS(dVar5))) {
      __x = ABS(dVar5);
    }
  }
  *cost_scale = 1.0;
  if ((0.0 < __x) && ((__x < 0.0625 || (16.0 < __x)))) {
    dVar5 = log(__x);
    dVar5 = floor(dVar5 / 0.6931471805599453 + 0.5);
    dVar5 = exp2(dVar5);
    if (dVar5 <= dVar4) {
      dVar4 = dVar5;
    }
    *cost_scale = dVar4;
    if ((dVar4 != 1.0) || (NAN(dVar4))) {
      pdVar1 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = 0;
      uVar2 = (ulong)(uint)lp->num_col_;
      if (lp->num_col_ < 1) {
        uVar2 = uVar3;
      }
      for (; dVar4 = *cost_scale, uVar2 != uVar3; uVar3 = uVar3 + 1) {
        pdVar1[uVar3] = pdVar1[uVar3] / dVar4;
      }
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                   "LP cost vector scaled down by %g: max cost is %g\n",dVar4,__x / dVar4);
      return;
    }
  }
  highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
               "LP cost vector not scaled down: max cost is %g\n",__x);
  return;
}

Assistant:

void scaleSimplexCost(const HighsOptions& options, HighsLp& lp,
                      double& cost_scale) {
  // Scale the costs by no less than minAlwCostScale
  double max_allowed_cost_scale = pow(2.0, options.allowed_cost_scale_factor);
  double max_nonzero_cost = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (lp.col_cost_[iCol]) {
      max_nonzero_cost = max(fabs(lp.col_cost_[iCol]), max_nonzero_cost);
    }
  }
  // Scaling the costs up effectively increases the dual tolerance to
  // which the problem is solved - so, if the max cost is small the
  // scaling factor pushes it up by a power of 2 so it's close to 1
  // Scaling the costs down effectively decreases the dual tolerance
  // to which the problem is solved - so this can't be done too much
  cost_scale = 1;
  const double ln2 = log(2.0);
  // Scale if the max cost is positive and outside the range [1/16, 16]
  if ((max_nonzero_cost > 0) &&
      ((max_nonzero_cost < (1.0 / 16)) || (max_nonzero_cost > 16))) {
    cost_scale = max_nonzero_cost;
    cost_scale = pow(2.0, floor(log(cost_scale) / ln2 + 0.5));
    cost_scale = min(cost_scale, max_allowed_cost_scale);
  }
  if (cost_scale == 1) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "LP cost vector not scaled down: max cost is %g\n",
                 max_nonzero_cost);
    return;
  }
  // Scale the costs (and record of max_nonzero_cost) by cost_scale, being at
  // most max_allowed_cost_scale
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    lp.col_cost_[iCol] /= cost_scale;
  }
  max_nonzero_cost /= cost_scale;
  highsLogUser(options.log_options, HighsLogType::kInfo,
               "LP cost vector scaled down by %g: max cost is %g\n", cost_scale,
               max_nonzero_cost);
}